

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

disk_config * __thiscall foxxll::config::disk(config *this,size_t disk)

{
  size_type sVar1;
  reference pvVar2;
  size_t disk_local;
  config *this_local;
  
  check_initialized(this);
  sVar1 = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::size
                    (&this->disks_list);
  if (disk < sVar1) {
    pvVar2 = std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::operator[]
                       (&this->disks_list,disk);
    return pvVar2;
  }
  __assert_fail("disk < disks_list.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stxxl[P]foxxll/foxxll/mng/config.cpp"
                ,0xde,"disk_config &foxxll::config::disk(size_t)");
}

Assistant:

disk_config& config::disk(size_t disk)
{
    check_initialized();
    assert(disk < disks_list.size());
    return disks_list[disk];
}